

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O2

void * tcmalloc::LowLevelAlloc::AllocWithArena(size_t request,Arena *arena)

{
  AllocList *head;
  long *plVar1;
  AllocList *e;
  ulong uVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t new_pages_size;
  AllocList *pAVar4;
  char *pcVar5;
  ulong size;
  undefined8 uStack_140;
  AllocList *local_138;
  AllocList *prev [30];
  SpinLockHolder local_38;
  SpinLockHolder locker;
  
  if (request == 0) {
    return (void *)0x0;
  }
  if ((arena == (Arena *)0x0) && (arena = DefaultArena::arena, DefaultArena::arena == (Arena *)0x0))
  {
    Arena::Arena((Arena *)default_arena_storage);
    DefaultArena::arena = (Arena *)default_arena_storage;
    arena = (Arena *)default_arena_storage;
  }
  local_38.lock_ = &arena->mu;
  SpinLock::Lock(&arena->mu);
  size = -arena->roundup & request + arena->roundup + 0x1f;
  head = &arena->freelist;
  do {
    iVar3 = LLA_SkiplistLevels(size,arena->min_size,false);
    if (iVar3 <= (arena->freelist).levels) {
      pAVar4 = head;
      while( true ) {
        if (pAVar4->levels < iVar3) {
          pcVar5 = "Check failed: i < prev->levels: too few levels in Next()\n";
          uStack_140 = 0x39;
          goto LAB_0011f6b3;
        }
        e = pAVar4->next[iVar3 - 1];
        if (e == (AllocList *)0x0) break;
        if (((e->header).magic ^ (ulong)e) != 0xffffffffb37cc16a) {
          pcVar5 = 
          "Check failed: next->header.magic == Magic(kMagicUnallocated, &next->header): bad magic number in Next()\n"
          ;
          uStack_140 = 0x68;
          goto LAB_0011f6b3;
        }
        if ((e->header).arena != arena) {
          pcVar5 = "Check failed: next->header.arena == arena: bad arena pointer in Next()\n";
          uStack_140 = 0x47;
          goto LAB_0011f6b3;
        }
        if (head != pAVar4) {
          if (e <= pAVar4) {
            pcVar5 = "Check failed: prev < next: unordered freelist\n";
            uStack_140 = 0x2e;
            goto LAB_0011f6b3;
          }
          if (e <= (AllocList *)((long)pAVar4->next + (pAVar4->header).size + -0x28)) {
            pcVar5 = 
            "Check failed: reinterpret_cast<char *>(prev) + prev->header.size < reinterpret_cast<char *>(next): malformed freelist\n"
            ;
            uStack_140 = 0x76;
            goto LAB_0011f6b3;
          }
        }
        pAVar4 = e;
        if (size <= (ulong)(e->header).size) {
          LLA_SkiplistDelete(head,e,&local_138);
          uVar2 = (e->header).size;
          if (arena->min_size + size <= uVar2) {
            plVar1 = (long *)((long)e->next + (size - 0x28));
            *plVar1 = uVar2 - size;
            plVar1[1] = (long)e->next + (size - 0x28) ^ 0x4c833e95;
            plVar1[2] = (long)arena;
            (e->header).size = size;
            AddToFreelist(plVar1 + 4,arena);
          }
          (e->header).magic = (ulong)e ^ 0x4c833e95;
          if ((e->header).arena == arena) {
            arena->allocation_count = arena->allocation_count + 1;
            SpinLockHolder::~SpinLockHolder(&local_38);
            return &e->levels;
          }
          pcVar5 = "Check failed: s->header.arena == arena: \n";
          uStack_140 = 0x29;
LAB_0011f6b3:
          syscall(1,2,pcVar5,uStack_140);
          abort();
        }
      }
    }
    SpinLock::Unlock(&arena->mu);
    iVar3 = (*arena->allocator->_vptr_PagesAllocator[2])
                      (arena->allocator,size + 0xfffff & 0xfffffffffff00000);
    SpinLock::Lock(&arena->mu);
    Arena::InsertAllocatedMemoryLocked(arena,(void *)CONCAT44(extraout_var,iVar3),new_pages_size);
  } while( true );
}

Assistant:

void *LowLevelAlloc::AllocWithArena(size_t request, Arena *arena) {
  if (!request) {
    return nullptr;
  }

  if (!arena) {
    arena = DefaultArena();
  }

  AllocList *s;       // will point to region that satisfies request
  SpinLockHolder locker{&arena->mu};

  // round up with header
  size_t req_rnd = RoundUp(request + sizeof (s->header), arena->roundup);
  for (;;) {      // loop until we find a suitable region
    // find the minimum levels that a block of this size must have
    int i = LLA_SkiplistLevels(req_rnd, arena->min_size, false) - 1;
    if (i < arena->freelist.levels) {   // potential blocks exist
      AllocList *before = &arena->freelist;  // predecessor of s
      while ((s = Next(i, before, arena)) != 0 && s->header.size < req_rnd) {
        before = s;
      }
      if (s != 0) {       // we found a region
        break;
      }
    }
    // we unlock before mmap() both because mmap() may call a callback hook,
    // and because it may be slow.
    arena->mu.Unlock();

    size_t new_pages_size = RoundUp(req_rnd, kMinimalRegion);
    void *new_pages;
    std::tie(new_pages, new_pages_size) = arena->allocator->MapPages(new_pages_size);

    arena->mu.Lock();
    arena->InsertAllocatedMemoryLocked(new_pages, new_pages_size);
  }
  AllocList *prev[kMaxLevel];
  LLA_SkiplistDelete(&arena->freelist, s, prev);    // remove from free list
  // s points to the first free region that's big enough
  if (req_rnd + arena->min_size <= s->header.size) {  // big enough to split
    AllocList *n = reinterpret_cast<AllocList *>
      (req_rnd + reinterpret_cast<char *>(s));
    n->header.size = s->header.size - req_rnd;
    n->header.magic = Magic(kMagicAllocated, &n->header);
    n->header.arena = arena;
    s->header.size = req_rnd;
    AddToFreelist(&n->levels, arena);
  }
  s->header.magic = Magic(kMagicAllocated, &s->header);
  RAW_CHECK(s->header.arena == arena, "");
  arena->allocation_count++;

  return &s->levels;
}